

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

void reset_state(vw *all,bfgs *b,bool zero)

{
  undefined3 in_register_00000011;
  
  b->lastj = 0;
  b->origin = 0;
  b->loss_sum = 0.0;
  b->previous_loss_sum = 0.0;
  b->importance_weight_sum = 0.0;
  b->curvature = 0.0;
  b->first_pass = true;
  b->gradient_pass = true;
  b->preconditioner_pass = true;
  if (CONCAT31(in_register_00000011,zero) != 0) {
    zero_derivative(all);
    zero_preconditioner(all);
    return;
  }
  return;
}

Assistant:

void reset_state(vw& all, bfgs& b, bool zero)
{
  b.lastj = b.origin = 0;
  b.loss_sum = b.previous_loss_sum = 0.;
  b.importance_weight_sum = 0.;
  b.curvature = 0.;
  b.first_pass = true;
  b.gradient_pass = true;
  b.preconditioner_pass = true;
  if (zero)
  {
    zero_derivative(all);
    zero_preconditioner(all);
  }
}